

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O2

_Bool netaddr_binary_is_in_subnet(netaddr *subnet,void *bin,size_t len,uint8_t af_family)

{
  byte bVar1;
  _Bool _Var2;
  
  if (subnet->_type == af_family) {
    bVar1 = netaddr_get_af_maxprefix((uint)af_family);
    if (len << 3 == (ulong)bVar1) {
      _Var2 = _binary_is_in_subnet(subnet,bin);
      return _Var2;
    }
  }
  return false;
}

Assistant:

bool
netaddr_binary_is_in_subnet(const struct netaddr *subnet, const void *bin, size_t len, uint8_t af_family) {
  if (subnet->_type != af_family || netaddr_get_maxprefix(subnet) != len * 8) {
    return false;
  }
  return _binary_is_in_subnet(subnet, bin);
}